

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_empty_env(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  uv_loop_t *loop;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  char *env [1];
  
  pcVar2 = getenv("DYLD_LIBRARY_PATH");
  if (((pcVar2 == (char *)0x0) && (pcVar2 = getenv("LD_LIBRARY_PATH"), pcVar2 == (char *)0x0)) &&
     (pcVar2 = getenv("LIBPATH"), pcVar2 == (char *)0x0)) {
    init_process_options("spawn_helper1",exit_cb);
    options.env = env;
    env[0] = (char *)0x0;
    uVar3 = uv_default_loop();
    iVar1 = uv_spawn(uVar3,&process,&options);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      uVar3 = uv_default_loop();
      iVar1 = uv_run(uVar3,0);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        eval_a = 1;
        eval_b = (int64_t)exit_cb_called;
        if (eval_b == 1) {
          eval_a = 1;
          eval_b = (int64_t)close_cb_called;
          if (eval_b == 1) {
            loop = (uv_loop_t *)uv_default_loop();
            close_loop(loop);
            eval_a = 0;
            uVar3 = uv_default_loop();
            iVar1 = uv_loop_close(uVar3);
            eval_b = (int64_t)iVar1;
            if (eval_b == 0) {
              uv_library_shutdown();
              return 0;
            }
            pcVar4 = "uv_loop_close(uv_default_loop())";
            pcVar2 = "0";
            uVar3 = 0x108;
          }
          else {
            pcVar4 = "close_cb_called";
            pcVar2 = "1";
            uVar3 = 0x106;
          }
        }
        else {
          pcVar4 = "exit_cb_called";
          pcVar2 = "1";
          uVar3 = 0x105;
        }
      }
      else {
        pcVar4 = "0";
        pcVar2 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
        uVar3 = 0x103;
      }
    }
    else {
      pcVar4 = "0";
      pcVar2 = "uv_spawn(uv_default_loop(), &process, &options)";
      uVar3 = 0x102;
    }
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,uVar3,pcVar2,"==",pcVar4,eval_a,"==",eval_b);
    abort();
  }
  fprintf(_stderr,"%s\n","doesn\'t work with DYLD_LIBRARY_PATH/LD_LIBRARY_PATH/LIBPATH");
  fflush(_stderr);
  return 7;
}

Assistant:

TEST_IMPL(spawn_empty_env) {
  char* env[1];

  /* The autotools dynamic library build requires the presence of
   * DYLD_LIBARY_PATH (macOS) or LD_LIBRARY_PATH/LIBPATH (other Unices)
   * in the environment, but of course that doesn't work with
   * the empty environment that we're testing here.
   */
  if (NULL != getenv("DYLD_LIBRARY_PATH") ||
      NULL != getenv("LD_LIBRARY_PATH") ||
      NULL != getenv("LIBPATH")) {
    RETURN_SKIP("doesn't work with DYLD_LIBRARY_PATH/LD_LIBRARY_PATH/LIBPATH");
  }

  init_process_options("spawn_helper1", exit_cb);
  options.env = env;
  env[0] = NULL;

  ASSERT_OK(uv_spawn(uv_default_loop(), &process, &options));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}